

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-types.cpp
# Opt level: O1

void __thiscall wasm::Fuzzer::checkSubtypes(Fuzzer *this)

{
  ostream *poVar1;
  uint uVar2;
  pointer pvVar3;
  uint *puVar4;
  pointer pHVar5;
  char cVar6;
  ulong uVar7;
  uint *puVar8;
  undefined1 local_1b8 [392];
  
  if ((this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      pvVar3 = (this->subtypeIndices).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = *(pointer *)
                ((long)&pvVar3[uVar7].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data + 8);
      for (puVar8 = pvVar3[uVar7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start; puVar8 != puVar4; puVar8 = puVar8 + 1)
      {
        uVar2 = *puVar8;
        pHVar5 = (this->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        cVar6 = wasm::HeapType::isSubType((HeapType)pHVar5[uVar2].id,(HeapType)pHVar5[uVar7].id);
        if (cVar6 == '\0') {
          Fatal::Fatal((Fatal *)local_1b8);
          poVar1 = (ostream *)(local_1b8 + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"HeapType ",9);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar1," should be a subtype of HeapType ",0x21);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," but is not!\n",0xd);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
          wasm::operator<<(poVar1,(HeapType)
                                  (this->types).
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar2].id);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
          wasm::operator<<(poVar1,(HeapType)
                                  (this->types).
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar7].id);
          Fatal::operator<<((Fatal *)local_1b8,(char (*) [2])0x19482f);
          Fatal::~Fatal((Fatal *)local_1b8);
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)(this->types).
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->types).
                                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void Fuzzer::checkSubtypes() const {
  for (size_t super = 0; super < types.size(); ++super) {
    for (auto sub : subtypeIndices[super]) {
      if (!HeapType::isSubType(types[sub], types[super])) {
        Fatal() << "HeapType " << sub << " should be a subtype of HeapType "
                << super << " but is not!\n"
                << sub << ": " << types[sub] << "\n"
                << super << ": " << types[super] << "\n";
      }
    }
  }
}